

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

void __thiscall
glu::TextureBuffer::TextureBuffer
          (TextureBuffer *this,RenderContext *context,deUint32 internalFormat,size_t bufferSize,
          size_t offset,size_t size,void *data)

{
  size_t size_local;
  size_t offset_local;
  size_t bufferSize_local;
  deUint32 internalFormat_local;
  RenderContext *context_local;
  TextureBuffer *this_local;
  
  this->m_context = context;
  this->m_format = 0;
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::ArrayBuffer(&this->m_refBuffer);
  this->m_offset = 0;
  this->m_size = 0;
  this->m_glTexture = 0;
  this->m_glBuffer = 0;
  init(this,(EVP_PKEY_CTX *)(ulong)internalFormat);
  return;
}

Assistant:

TextureBuffer::TextureBuffer (const RenderContext& context, deUint32 internalFormat, size_t bufferSize, size_t offset, size_t size, const void* data)
	: m_context			(context)
	, m_format			(0)
	, m_offset			(0)
	, m_size			(0)
	, m_glTexture		(0)
	, m_glBuffer		(0)
{
	init(internalFormat, bufferSize, offset, size, data);
}